

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O2

bool __thiscall FirewirePort::Init(FirewirePort *this)

{
  uint uVar1;
  int iVar2;
  raw1394handle_t prVar3;
  ostream *poVar4;
  FirewirePort *pFVar5;
  bus_reset_handler_t p_Var6;
  void *pvVar7;
  pointer ppFVar8;
  ulong uVar9;
  char *pcVar10;
  FirewirePort *local_38;
  
  prVar3 = (raw1394handle_t)raw1394_new_handle();
  this->handle = prVar3;
  ppFVar8 = PortList.super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (prVar3 == (raw1394handle_t)0x0) {
    poVar4 = std::operator<<((this->super_BasePort).outStr,
                             "FirewirePort::Init: error, could not create handle");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    for (; ppFVar8 !=
           PortList.super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>._M_impl.
           super__Vector_impl_data._M_finish; ppFVar8 = ppFVar8 + 1) {
      pFVar5 = *ppFVar8;
      if ((pFVar5->super_BasePort).PortNum == (this->super_BasePort).PortNum) {
        poVar4 = std::operator<<((this->super_BasePort).outStr,"FirewirePort::Init: warning, port ")
        ;
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->super_BasePort).PortNum);
        poVar4 = std::operator<<(poVar4," is already used (be careful about thread safety)");
        std::endl<char,std::char_traits<char>>(poVar4);
        pFVar5 = *ppFVar8;
      }
      if (pFVar5->handle == this->handle) {
        poVar4 = std::operator<<((this->super_BasePort).outStr,
                                 "FirewirePort::Init: warning, handle is already used");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
    local_38 = this;
    std::vector<FirewirePort*,std::allocator<FirewirePort*>>::emplace_back<FirewirePort*>
              ((vector<FirewirePort*,std::allocator<FirewirePort*>> *)&PortList,&local_38);
    builtin_memcpy((this->super_BasePort).Node2Board,
                   "\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10"
                   ,0x40);
    p_Var6 = (bus_reset_handler_t)raw1394_set_bus_reset_handler(this->handle,reset_handler);
    this->old_reset_handler = p_Var6;
    uVar1 = raw1394_get_port_info(this->handle,0,0);
    poVar4 = std::operator<<((this->super_BasePort).outStr,"FirewirePort::Init: number of ports = ")
    ;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
    std::endl<char,std::char_traits<char>>(poVar4);
    if (0 < (int)uVar1) {
      pvVar7 = operator_new__((ulong)uVar1 * 0x24);
      raw1394_get_port_info(this->handle,pvVar7,uVar1);
      pcVar10 = (char *)((long)pvVar7 + 4);
      for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
        poVar4 = std::operator<<((this->super_BasePort).outStr,"  Port ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)uVar9);
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::operator<<(poVar4,pcVar10);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(pcVar10 + -4));
        poVar4 = std::operator<<(poVar4," nodes");
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar10 = pcVar10 + 0x24;
      }
      operator_delete__(pvVar7);
    }
    if ((int)uVar1 < (this->super_BasePort).PortNum) {
      poVar4 = std::operator<<((this->super_BasePort).outStr,"FirewirePort::Init: port ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->super_BasePort).PortNum);
      poVar4 = std::operator<<(poVar4," does not exist");
    }
    else {
      iVar2 = raw1394_set_port(this->handle);
      poVar4 = (this->super_BasePort).outStr;
      if (iVar2 == 0) {
        poVar4 = std::operator<<(poVar4,"FirewirePort::Init: successfully initialized port ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->super_BasePort).PortNum);
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((this->super_BasePort).outStr,"Using libraw1394 version ");
        pcVar10 = (char *)raw1394_get_libversion();
        poVar4 = std::operator<<(poVar4,pcVar10);
        std::endl<char,std::char_traits<char>>(poVar4);
        StopCycleStartPacket(this);
        iVar2 = (*(this->super_BasePort)._vptr_BasePort[3])(this);
        if ((char)iVar2 == '\0') {
          return false;
        }
        BasePort::SetDefaultProtocol(&this->super_BasePort);
        return true;
      }
      poVar4 = std::operator<<(poVar4,"FirewirePort::Init: error setting port to ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->super_BasePort).PortNum);
    }
    std::endl<char,std::char_traits<char>>(poVar4);
    raw1394_destroy_handle(this->handle);
    this->handle = (raw1394handle_t)0x0;
  }
  return false;
}

Assistant:

bool FirewirePort::Init(void)
{
    // create firewire port handle
    handle = raw1394_new_handle();
    if (!handle) {
        outStr << "FirewirePort::Init: error, could not create handle" << std::endl;
        return false;
    }

    PortListType::const_iterator it;
    for (it = PortList.begin(); it != PortList.end(); it++) {
        if ((*it)->PortNum == PortNum)
            outStr << "FirewirePort::Init: warning, port " << PortNum
                   << " is already used (be careful about thread safety)" << std::endl;
        if ((*it)->handle == handle) // should never happen
            outStr << "FirewirePort::Init: warning, handle is already used" << std::endl;
    }
    PortList.push_back(this);

    memset(Node2Board, BoardIO::MAX_BOARDS, sizeof(Node2Board));

    // set the bus reset handler
    old_reset_handler = raw1394_set_bus_reset_handler(handle, reset_handler);

    // get number of ports
    int nports = raw1394_get_port_info(handle, NULL, 0);
    outStr << "FirewirePort::Init: number of ports = " << nports << std::endl;
    if (nports > 0) {
        struct raw1394_portinfo *pinfo = new raw1394_portinfo[nports];
        raw1394_get_port_info(handle, pinfo, nports);
        for (int i = 0; i < nports; i++)
            outStr << "  Port " << i << ": " << pinfo[i].name << ", " << pinfo[i].nodes << " nodes" << std::endl;
        delete [] pinfo;
    }
    if (nports < PortNum) {
        outStr << "FirewirePort::Init: port " << PortNum << " does not exist" << std::endl;
        raw1394_destroy_handle(handle);
        handle = NULL;
        return false;
    }

    if (raw1394_set_port(handle, PortNum)) {
        outStr << "FirewirePort::Init: error setting port to " << PortNum << std::endl;
        raw1394_destroy_handle(handle);
        handle = NULL;
        return false;
    }
    outStr << "FirewirePort::Init: successfully initialized port " << PortNum << std::endl;
    outStr << "Using libraw1394 version " << raw1394_get_libversion() << std::endl;

    // stop cycle start packet
    StopCycleStartPacket();

    bool ret = ScanNodes();
    if (ret)
        SetDefaultProtocol();
    return ret;
}